

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-apply.cc
# Opt level: O1

bool tinyusdz::tydra::ApplyToXformable
               (Stage *stage,Prim *prim,
               function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)> *fn)

{
  GeomMesh *pGVar1;
  byte unaff_BPL;
  Value *this;
  GeomMesh *local_30;
  
  this = &prim->_data;
  pGVar1 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GPrim>(this,false);
  if (pGVar1 != (GeomMesh *)0x0) {
    local_30 = pGVar1;
    if (*(long *)(fn + 0x10) == 0) goto LAB_003f1102;
    unaff_BPL = (**(code **)(fn + 0x18))(fn,stage,&local_30);
  }
  if (pGVar1 == (GeomMesh *)0x0) {
    pGVar1 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::Xform>(this,false);
    if (pGVar1 != (GeomMesh *)0x0) {
      local_30 = pGVar1;
      if (*(long *)(fn + 0x10) == 0) goto LAB_003f1102;
      unaff_BPL = (**(code **)(fn + 0x18))(fn,stage,&local_30);
    }
    if (pGVar1 != (GeomMesh *)0x0) goto LAB_003f10ef;
    pGVar1 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(this,false);
    if (pGVar1 != (GeomMesh *)0x0) {
      local_30 = pGVar1;
      if (*(long *)(fn + 0x10) == 0) goto LAB_003f1102;
      unaff_BPL = (**(code **)(fn + 0x18))(fn,stage,&local_30);
    }
    if (pGVar1 != (GeomMesh *)0x0) goto LAB_003f10ef;
    pGVar1 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GeomSphere>(this,false);
    if (pGVar1 != (GeomMesh *)0x0) {
      local_30 = pGVar1;
      if (*(long *)(fn + 0x10) == 0) goto LAB_003f1102;
      unaff_BPL = (**(code **)(fn + 0x18))(fn,stage,&local_30);
    }
    if (pGVar1 != (GeomMesh *)0x0) goto LAB_003f10ef;
    pGVar1 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GeomCapsule>(this,false);
    if (pGVar1 != (GeomMesh *)0x0) {
      local_30 = pGVar1;
      if (*(long *)(fn + 0x10) == 0) goto LAB_003f1102;
      unaff_BPL = (**(code **)(fn + 0x18))(fn,stage,&local_30);
    }
    if (pGVar1 != (GeomMesh *)0x0) goto LAB_003f10ef;
    pGVar1 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GeomCube>(this,false);
    if (pGVar1 != (GeomMesh *)0x0) {
      local_30 = pGVar1;
      if (*(long *)(fn + 0x10) == 0) goto LAB_003f1102;
      unaff_BPL = (**(code **)(fn + 0x18))(fn,stage,&local_30);
    }
    if (pGVar1 != (GeomMesh *)0x0) goto LAB_003f10ef;
    pGVar1 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GeomPoints>(this,false);
    if (pGVar1 != (GeomMesh *)0x0) {
      local_30 = pGVar1;
      if (*(long *)(fn + 0x10) == 0) goto LAB_003f1102;
      unaff_BPL = (**(code **)(fn + 0x18))(fn,stage,&local_30);
    }
    if (pGVar1 != (GeomMesh *)0x0) goto LAB_003f10ef;
    pGVar1 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GeomCylinder>(this,false);
    if (pGVar1 != (GeomMesh *)0x0) {
      local_30 = pGVar1;
      if (*(long *)(fn + 0x10) == 0) goto LAB_003f1102;
      unaff_BPL = (**(code **)(fn + 0x18))(fn,stage,&local_30);
    }
    if (pGVar1 != (GeomMesh *)0x0) goto LAB_003f10ef;
    pGVar1 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GeomBasisCurves>(this,false);
    if (pGVar1 != (GeomMesh *)0x0) {
      local_30 = pGVar1;
      if (*(long *)(fn + 0x10) == 0) goto LAB_003f1102;
      unaff_BPL = (**(code **)(fn + 0x18))(fn,stage,&local_30);
    }
    if (pGVar1 == (GeomMesh *)0x0) {
      unaff_BPL = 0;
      local_30 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::SkelRoot>(this,false);
      if (local_30 != (GeomMesh *)0x0) {
        if (*(long *)(fn + 0x10) == 0) {
LAB_003f1102:
          ::std::__throw_bad_function_call();
        }
        unaff_BPL = (**(code **)(fn + 0x18))(fn,stage,&local_30);
      }
    }
  }
LAB_003f10ef:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ApplyToXformable(
  const Stage &stage, const Prim &prim,
  std::function<bool(const Stage &stage, const Xformable *xformable)> fn) {

  (void)stage;

#define APPLY_FUN(__ty) { \
  const auto *v = prim.as<__ty>(); \
  if (v) { \
    return fn(stage, v); \
  } \
  }

  APPLY_FUN(GPrim)
  APPLY_FUN(Xform)
  APPLY_FUN(GeomMesh)
  APPLY_FUN(GeomSphere)
  APPLY_FUN(GeomCapsule)
  APPLY_FUN(GeomCube)
  APPLY_FUN(GeomPoints)
  APPLY_FUN(GeomCylinder)
  APPLY_FUN(GeomBasisCurves)
  APPLY_FUN(SkelRoot)

#undef APPLY_FUN

  return false;

}